

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack_unpack.c
# Opt level: O0

json_t * pack(scanner_t *s,va_list *ap)

{
  uint uVar1;
  bool bVar2;
  long *local_e8;
  undefined8 *local_d0;
  double *local_b8;
  longlong *local_98;
  int *local_80;
  scanner_t *local_68;
  int *local_60;
  json_t *json_1;
  int nullable_1;
  json_t *json;
  int nullable;
  va_list *ap_local;
  scanner_t *s_local;
  
  switch((s->token).token) {
  case 'I':
    uVar1 = (*ap)[0].gp_offset;
    if (uVar1 < 0x29) {
      local_98 = (longlong *)((long)(int)uVar1 + (long)(*ap)[0].reg_save_area);
      (*ap)[0].gp_offset = uVar1 + 8;
    }
    else {
      local_98 = (longlong *)(*ap)[0].overflow_arg_area;
      (*ap)[0].overflow_arg_area = local_98 + 1;
    }
    s_local = (scanner_t *)json_integer(*local_98);
    break;
  default:
    set_error(s,"<format>","Unexpected format character \'%c\'",(ulong)(uint)(int)(s->token).token);
    s_local = (scanner_t *)0x0;
    break;
  case 'O':
    next_token(s);
    bVar2 = (s->token).token != '?';
    if (bVar2) {
      prev_token(s);
    }
    uVar1 = (*ap)[0].gp_offset;
    if (uVar1 < 0x29) {
      local_d0 = (undefined8 *)((long)(int)uVar1 + (long)(*ap)[0].reg_save_area);
      (*ap)[0].gp_offset = uVar1 + 8;
    }
    else {
      local_d0 = (undefined8 *)(*ap)[0].overflow_arg_area;
      (*ap)[0].overflow_arg_area = local_d0 + 1;
    }
    if (((json_t *)*local_d0 != (json_t *)0x0) || (bVar2)) {
      s_local = (scanner_t *)json_incref((json_t *)*local_d0);
    }
    else {
      s_local = (scanner_t *)json_null();
    }
    break;
  case '[':
    s_local = (scanner_t *)pack_array(s,ap);
    break;
  case 'b':
    uVar1 = (*ap)[0].gp_offset;
    if (uVar1 < 0x29) {
      local_60 = (int *)((long)(int)uVar1 + (long)(*ap)[0].reg_save_area);
      (*ap)[0].gp_offset = uVar1 + 8;
    }
    else {
      local_60 = (int *)(*ap)[0].overflow_arg_area;
      (*ap)[0].overflow_arg_area = local_60 + 2;
    }
    if (*local_60 == 0) {
      local_68 = (scanner_t *)json_false();
    }
    else {
      local_68 = (scanner_t *)json_true();
    }
    s_local = local_68;
    break;
  case 'f':
    uVar1 = (*ap)[0].fp_offset;
    if (uVar1 < 0xa1) {
      local_b8 = (double *)((long)(int)uVar1 + (long)(*ap)[0].reg_save_area);
      (*ap)[0].fp_offset = uVar1 + 0x10;
    }
    else {
      local_b8 = (double *)(*ap)[0].overflow_arg_area;
      (*ap)[0].overflow_arg_area = local_b8 + 1;
    }
    s_local = (scanner_t *)json_real(*local_b8);
    break;
  case 'i':
    uVar1 = (*ap)[0].gp_offset;
    if (uVar1 < 0x29) {
      local_80 = (int *)((long)(int)uVar1 + (long)(*ap)[0].reg_save_area);
      (*ap)[0].gp_offset = uVar1 + 8;
    }
    else {
      local_80 = (int *)(*ap)[0].overflow_arg_area;
      (*ap)[0].overflow_arg_area = local_80 + 2;
    }
    s_local = (scanner_t *)json_integer((long)*local_80);
    break;
  case 'n':
    s_local = (scanner_t *)json_null();
    break;
  case 'o':
    next_token(s);
    bVar2 = (s->token).token != '?';
    if (bVar2) {
      prev_token(s);
    }
    uVar1 = (*ap)[0].gp_offset;
    if (uVar1 < 0x29) {
      local_e8 = (long *)((long)(int)uVar1 + (long)(*ap)[0].reg_save_area);
      (*ap)[0].gp_offset = uVar1 + 8;
    }
    else {
      local_e8 = (long *)(*ap)[0].overflow_arg_area;
      (*ap)[0].overflow_arg_area = local_e8 + 1;
    }
    s_local = (scanner_t *)*local_e8;
    if ((s_local == (scanner_t *)0x0) && (!bVar2)) {
      s_local = (scanner_t *)json_null();
    }
    break;
  case 's':
    s_local = (scanner_t *)pack_string(s,ap);
    break;
  case '{':
    s_local = (scanner_t *)pack_object(s,ap);
  }
  return (json_t *)s_local;
}

Assistant:

static json_t *pack(scanner_t *s, va_list *ap)
{
    switch(token(s)) {
        case '{':
            return pack_object(s, ap);

        case '[':
            return pack_array(s, ap);

        case 's': /* string */
            return pack_string(s, ap);

        case 'n': /* null */
            return json_null();

        case 'b': /* boolean */
            return va_arg(*ap, int) ? json_true() : json_false();

        case 'i': /* integer from int */
            return json_integer(va_arg(*ap, int));

        case 'I': /* integer from json_int_t */
            return json_integer(va_arg(*ap, json_int_t));

        case 'f': /* real */
            return json_real(va_arg(*ap, double));

        case 'O': /* a json_t object; increments refcount */
        {
            int nullable;
            json_t *json;

            next_token(s);
            nullable = token(s) == '?';
            if (!nullable)
                prev_token(s);

            json = va_arg(*ap, json_t *);
            if (!json && nullable) {
                return json_null();
            } else {
                return json_incref(json);
            }
        }

        case 'o': /* a json_t object; doesn't increment refcount */
        {
            int nullable;
            json_t *json;

            next_token(s);
            nullable = token(s) == '?';
            if (!nullable)
                prev_token(s);

            json = va_arg(*ap, json_t *);
            if (!json && nullable) {
                return json_null();
            } else {
                return json;
            }
        }

        default:
            set_error(s, "<format>", "Unexpected format character '%c'",
                      token(s));
            return NULL;
    }
}